

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::
ElementsAreMatcherImpl<const_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_&>
::MatchAndExplain(ElementsAreMatcherImpl<const_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_&>
                  *this,vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                        *container,MatchResultListener *listener)

{
  ostream *poVar1;
  pointer pMVar2;
  pointer pLVar3;
  bool bVar4;
  int iVar5;
  MatchResultListener *pMVar6;
  long lVar7;
  size_t count;
  bool bVar8;
  pointer x;
  long lVar9;
  size_t sVar10;
  pointer pbVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  StringMatchResultListener s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [32];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  poVar1 = listener->stream_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_200,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)local_1c8);
  x = (container->
      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
      )._M_impl.super__Vector_impl_data._M_start;
  if (x == (container->
           super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
           )._M_impl.super__Vector_impl_data._M_finish) {
    sVar10 = 0;
    bVar8 = false;
  }
  else {
    lVar7 = 0;
    lVar9 = 0;
    sVar10 = 0;
    do {
      bVar8 = false;
      pMVar2 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (sVar10 == ((long)(this->matchers_).
                           super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 3) *
                    -0x5555555555555555) break;
      if (poVar1 == (ostream *)0x0) {
        local_1c8._8_8_ = (ostream *)0x0;
        local_1c8._0_8_ = &PTR__MatchResultListener_001b0680;
        bVar4 = MatcherBase<const_prometheus::ClientMetric::Label_&>::MatchAndExplain
                          ((MatcherBase<const_prometheus::ClientMetric::Label_&> *)
                           ((long)&(pMVar2->
                                   super_MatcherBase<const_prometheus::ClientMetric::Label_&>).
                                   super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                           lVar9),x,(MatchResultListener *)local_1c8);
      }
      else {
        local_1c8._8_8_ = local_1a8;
        local_1c8._0_8_ = &PTR__StringMatchResultListener_001b07a8;
        std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 0x10));
        bVar4 = MatcherBase<const_prometheus::ClientMetric::Label_&>::MatchAndExplain
                          ((MatcherBase<const_prometheus::ClientMetric::Label_&> *)
                           ((long)&(((this->matchers_).
                                     super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_MatcherBase<const_prometheus::ClientMetric::Label_&>).
                                   super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                           lVar9),x,(MatchResultListener *)local_1c8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)&((local_200.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7),
                   (string *)local_1e8);
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0]);
        }
        local_1c8._0_8_ = &PTR__StringMatchResultListener_001b07a8;
        std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 0x10));
        std::ios_base::~ios_base(local_138);
      }
      bVar8 = false;
      if (bVar4 == false) {
        bVar8 = true;
        break;
      }
      x = x + 1;
      sVar10 = sVar10 + 1;
      lVar9 = lVar9 + 0x18;
      lVar7 = lVar7 + 0x20;
    } while (x != (container->
                  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                  )._M_impl.super__Vector_impl_data._M_finish);
  }
  pLVar3 = (container->
           super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  count = sVar10;
  if (x != pLVar3) {
    count = sVar10 + ((ulong)((long)pLVar3 + (-0x40 - (long)x)) >> 6) + 1;
  }
  if (count == ((long)(this->matchers_).
                      super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->matchers_).
                      super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
    if (!bVar8) {
      bVar8 = true;
      if ((poVar1 != (ostream *)0x0) &&
         ((this->matchers_).
          super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->matchers_).
          super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        lVar9 = 8;
        bVar4 = false;
        lVar7 = 0;
        do {
          pbVar11 = local_200.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(long *)((long)&((local_200.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar9) != 0) {
            if (bVar4) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar6 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            if (pMVar6->stream_ != (ostream *)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)pMVar6->stream_);
            }
            pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [11])" matches, ");
            bVar4 = true;
            if (pMVar6->stream_ != (ostream *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (pMVar6->stream_,*(char **)((long)pbVar11 + lVar9 + -8),
                         *(long *)((long)&(pbVar11->_M_dataplus)._M_p + lVar9));
            }
          }
          lVar7 = lVar7 + 1;
          lVar9 = lVar9 + 0x20;
        } while (lVar7 != ((long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555);
      }
      goto LAB_0012ce53;
    }
    if (poVar1 != (ostream *)0x0) {
      pMVar6 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      if (pMVar6->stream_ != (ostream *)0x0) {
        std::ostream::_M_insert<unsigned_long>((ulong)pMVar6->stream_);
      }
      MatchResultListener::operator<<(pMVar6,(char (*) [15])" doesn\'t match");
      pbVar11 = local_200.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + sVar10;
      poVar1 = listener->stream_;
      iVar5 = std::__cxx11::string::compare((char *)pbVar11);
      bVar8 = false;
      if ((poVar1 == (ostream *)0x0) || (bVar8 = false, iVar5 == 0)) goto LAB_0012ce53;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(pbVar11->_M_dataplus)._M_p,pbVar11->_M_string_length);
    }
  }
  else {
    bVar8 = false;
    if ((poVar1 == (ostream *)0x0) || (count == 0)) goto LAB_0012ce53;
    pMVar6 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
    Elements((ElementsAreMatcherImpl<const_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_&>
              *)local_1c8,count);
    MatchResultListener::operator<<(pMVar6,(Message *)local_1c8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_1c8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_1c8._0_8_ + 8))();
    }
  }
  bVar8 = false;
LAB_0012ce53:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200);
  return bVar8;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    typename StlContainer::const_iterator it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }